

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

void __thiscall AbstractModuleClient::destroyHardwareConnection(AbstractModuleClient *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Trodes",&local_49);
  std::__cxx11::string::string((string *)&local_48,"HUPD",&local_4a);
  unsubscribeFromEvent(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  MlmWrap::destroy_hardware_connection(&this->super_MlmWrap);
  return;
}

Assistant:

void AbstractModuleClient::destroyHardwareConnection(){
    unsubscribeFromEvent(TRODES_NETWORK_ID, hardware_update);
    destroy_hardware_connection();
}